

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fdt.cc
# Opt level: O0

void __thiscall
dtc::fdt::device_tree::reassign_fragment_numbers(device_tree *this,node_ptr *node,int *delta)

{
  int iVar1;
  bool bVar2;
  __type _Var3;
  int iVar4;
  element_type *peVar5;
  ostream *this_00;
  string local_218 [32];
  ostringstream local_1f8 [8];
  ostringstream new_address;
  int current_address;
  allocator<char> local_69;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  __shared_ptr_access<dtc::fdt::node,_(__gnu_cxx::_Lock_policy)2,_false,_false> *local_48;
  shared_ptr<dtc::fdt::node> *c;
  child_iterator __end2;
  child_iterator __begin2;
  child_range *__range2;
  int *delta_local;
  node_ptr *node_local;
  device_tree *this_local;
  
  peVar5 = std::__shared_ptr_access<dtc::fdt::node,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<dtc::fdt::node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)node);
  __begin2._M_current = (shared_ptr<dtc::fdt::node> *)fdt::node::child_nodes(peVar5);
  __end2 = fdt::node::child_range::begin((child_range *)&__begin2);
  c = (shared_ptr<dtc::fdt::node> *)fdt::node::child_range::end((child_range *)&__begin2);
  while (bVar2 = __gnu_cxx::operator!=
                           (&__end2,(__normal_iterator<std::shared_ptr<dtc::fdt::node>_*,_std::vector<std::shared_ptr<dtc::fdt::node>,_std::allocator<std::shared_ptr<dtc::fdt::node>_>_>_>
                                     *)&c), bVar2) {
    local_48 = (__shared_ptr_access<dtc::fdt::node,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               __gnu_cxx::
               __normal_iterator<std::shared_ptr<dtc::fdt::node>_*,_std::vector<std::shared_ptr<dtc::fdt::node>,_std::allocator<std::shared_ptr<dtc::fdt::node>_>_>_>
               ::operator*(&__end2);
    peVar5 = std::__shared_ptr_access<dtc::fdt::node,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->(local_48);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"fragment",&local_69);
    _Var3 = std::operator==(&peVar5->name,&local_68);
    std::__cxx11::string::~string((string *)&local_68);
    std::allocator<char>::~allocator(&local_69);
    if (_Var3) {
      peVar5 = std::__shared_ptr_access<dtc::fdt::node,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->(local_48);
      iVar4 = std::__cxx11::stoi(&peVar5->unit_address,(size_t *)0x0,0x10);
      std::__cxx11::ostringstream::ostringstream(local_1f8);
      iVar1 = *delta;
      *delta = iVar4 + iVar1 + 1;
      this_00 = (ostream *)std::ostream::operator<<((ostream *)local_1f8,std::hex);
      std::ostream::operator<<(this_00,iVar4 + iVar1);
      std::__cxx11::ostringstream::str();
      peVar5 = std::__shared_ptr_access<dtc::fdt::node,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->(local_48);
      std::__cxx11::string::operator=((string *)&peVar5->unit_address,local_218);
      std::__cxx11::string::~string(local_218);
      std::__cxx11::ostringstream::~ostringstream(local_1f8);
    }
    __gnu_cxx::
    __normal_iterator<std::shared_ptr<dtc::fdt::node>_*,_std::vector<std::shared_ptr<dtc::fdt::node>,_std::allocator<std::shared_ptr<dtc::fdt::node>_>_>_>
    ::operator++(&__end2);
  }
  return;
}

Assistant:

void
device_tree::reassign_fragment_numbers(node_ptr &node, int &delta)
{

	for (auto &c : node->child_nodes())
	{
		if (c->name == std::string("fragment"))
		{
			int current_address = std::stoi(c->unit_address, nullptr, 16);
			std::ostringstream new_address;
			current_address += delta;
			// It's possible that we hopped more than one somewhere, so just reset
			// delta to the next in sequence.
			delta = current_address + 1;
			new_address << std::hex << current_address;
			c->unit_address = new_address.str();
		}
	}
}